

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

int evfilt_read_knote_modify(filter *filt,knote *kn,kevent *kev)

{
  kevent *kev_local;
  knote *kn_local;
  filter *filt_local;
  int local_4;
  
  if ((kn->kn_flags & 1) == 0) {
    if ((kev->flags & 0x20) == 0) {
      local_4 = -1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int
evfilt_read_knote_modify(UNUSED struct filter *filt, struct knote *kn,
        const struct kevent *kev)
{
    if (!(kn->kn_flags & KNFL_FILE)) {
        /*
         * This should reset the EOF sate of the socket.
         * but it's not even clear what that really means.
         *
         * With the native kqueue implementations it
         * basically does nothing.
         */
        if ((kev->flags & EV_CLEAR))
            return (0);
        return (-1);
    }

    return (-1);
}